

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall QMessageBoxPrivate::setVisible(QMessageBoxPrivate *this,bool visible)

{
  char cVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,visible) != 0) {
    if (this->autoAddOkButton == true) {
      QMessageBox::addButton
                (*(QMessageBox **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8,
                 FirstButton);
    }
    detectEscapeButton(this);
  }
  cVar1 = (**(code **)(*(long *)&(this->super_QDialogPrivate).super_QWidgetPrivate + 0xa8))(this);
  if (cVar1 != '\0') {
    QDialogPrivate::setNativeDialogVisible(&this->super_QDialogPrivate,visible);
  }
  QWidget::setAttribute
            (*(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8,
             WA_DontShowOnScreen,(this->super_QDialogPrivate).nativeDialogInUse);
  QDialogPrivate::setVisible(&this->super_QDialogPrivate,visible);
  return;
}

Assistant:

void QMessageBoxPrivate::setVisible(bool visible)
{
    // Last minute setup
    if (visible) {
        Q_Q(QMessageBox);
        if (autoAddOkButton)
            q->addButton(QMessageBox::Ok);
        detectEscapeButton();
    }
    // On hide, we may be called from ~QDialog(), so prevent accessing
    // q_ptr as a QMessageBox!

    if (canBeNativeDialog())
        setNativeDialogVisible(visible);

    // Update WA_DontShowOnScreen based on whether the native dialog was shown,
    // so that QDialog::setVisible(visible) below updates the QWidget state correctly,
    // but skips showing the non-native version.
    static_cast<QWidget*>(q_ptr)->setAttribute(Qt::WA_DontShowOnScreen, nativeDialogInUse);

    QDialogPrivate::setVisible(visible);
}